

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

int __thiscall
NULLCPugiXML::xml_attribute__set_valueS(NULLCPugiXML *this,NULLCArray rhs,xml_attribute *ptr)

{
  xml_attribute *this_00;
  bool bVar1;
  undefined4 in_register_00000014;
  xml_attribute *ptr_local;
  NULLCArray rhs_local;
  
  this_00 = (xml_attribute *)CONCAT44(in_register_00000014,rhs.len);
  if (this == (NULLCPugiXML *)0x0) {
    bVar1 = pugi::xml_attribute::set_value(this_00,"");
    rhs_local.ptr._4_4_ = (uint)bVar1;
  }
  else if (((int)rhs.ptr == 0) ||
          (ptr = (xml_attribute *)(ulong)((int)rhs.ptr - 1), this[(long)ptr] != (NULLCPugiXML)0x0))
  {
    nullcThrowError("string has to be null-terminated",rhs.ptr,rhs.len,ptr);
    rhs_local.ptr._4_4_ = 0;
  }
  else {
    bVar1 = pugi::xml_attribute::set_value(this_00,(char_t *)this);
    rhs_local.ptr._4_4_ = (uint)bVar1;
  }
  return rhs_local.ptr._4_4_;
}

Assistant:

int		xml_attribute__set_valueS(NULLCArray rhs, xml_attribute* ptr)
	{
		if(!rhs.ptr)
			return ptr->attribute.set_value("");

		if(!rhs.len || rhs.ptr[rhs.len - 1])
		{
			nullcThrowError("string has to be null-terminated");
			return 0;
		}

		return ptr->attribute.set_value(rhs.ptr);
	}